

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.hpp
# Opt level: O1

void __thiscall
Args::Arg::Arg<char_const(&)[8]>(Arg *this,char (*name) [8],bool isWithValue,bool isRequired)

{
  size_t sVar1;
  
  (this->super_ArgIface).m_cmdLine = (CmdLine *)0x0;
  (this->super_ArgIface)._vptr_ArgIface = (_func_int **)&PTR__Arg_001339e0;
  this->m_isWithValue = isWithValue;
  this->m_isRequired = isRequired;
  this->m_isDefined = false;
  (this->m_value)._M_dataplus._M_p = (pointer)&(this->m_value).field_2;
  (this->m_value)._M_string_length = 0;
  (this->m_value).field_2._M_local_buf[0] = '\0';
  (this->m_flag)._M_dataplus._M_p = (pointer)&(this->m_flag).field_2;
  (this->m_flag)._M_string_length = 0;
  (this->m_flag).field_2._M_local_buf[0] = '\0';
  (this->m_name)._M_dataplus._M_p = (pointer)&(this->m_name).field_2;
  sVar1 = strlen(*name);
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->m_name,name,*name + sVar1);
  (this->m_valueSpecifier)._M_dataplus._M_p = (pointer)&(this->m_valueSpecifier).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->m_valueSpecifier,"arg","");
  (this->m_description)._M_dataplus._M_p = (pointer)&(this->m_description).field_2;
  (this->m_description)._M_string_length = 0;
  (this->m_description).field_2._M_local_buf[0] = '\0';
  (this->m_longDescription)._M_dataplus._M_p = (pointer)&(this->m_longDescription).field_2;
  (this->m_longDescription)._M_string_length = 0;
  (this->m_longDescription).field_2._M_local_buf[0] = '\0';
  (this->m_defaultValue)._M_dataplus._M_p = (pointer)&(this->m_defaultValue).field_2;
  (this->m_defaultValue)._M_string_length = 0;
  (this->m_defaultValue).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

Arg::Arg( T && name,
	bool isWithValue, bool isRequired )
	:	m_isWithValue( isWithValue )
	,	m_isRequired( isRequired )
	,	m_isDefined( false )
	,	m_name( std::forward< T > ( name ) )
	,	m_valueSpecifier( SL( "arg" ) )
{
}